

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OneHotEncoder.cpp
# Opt level: O1

void __thiscall CoreML::OneHotEncoder::OneHotEncoder(OneHotEncoder *this,string *description)

{
  Model *this_00;
  OneHotEncoder *this_01;
  
  Model::Model(&this->super_Model,description);
  (this->super_Model)._vptr_Model = (_func_int **)&PTR__Model_00432740;
  this_00 = (this->super_Model).m_spec.
            super___shared_ptr<CoreML::Specification::Model,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (this_00->_oneof_case_[0] != 600) {
    Specification::Model::clear_Type(this_00);
    this_00->_oneof_case_[0] = 600;
    this_01 = (OneHotEncoder *)operator_new(0x28);
    Specification::OneHotEncoder::OneHotEncoder(this_01);
    (this_00->Type_).onehotencoder_ = this_01;
  }
  return;
}

Assistant:

OneHotEncoder::OneHotEncoder(const std::string& description) :
    Model(description) {
        // make sure we become a one hot encoder
        (void) m_spec->mutable_onehotencoder();
    }